

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,char *binDir)

{
  size_t sVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  unsigned_long uVar6;
  char *pcVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  undefined1 local_170 [8];
  string m;
  undefined1 local_148 [8];
  string fullPath;
  allocator local_111;
  value_type local_110;
  _Self local_f0;
  allocator local_e1;
  key_type local_e0;
  _Self local_c0;
  undefined1 local_b8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  size_t fileNum;
  string local_78;
  Directory local_58;
  Directory dir;
  allocator local_39;
  string local_38 [8];
  string bdir;
  char *binDir_local;
  cmCoreTryCompile *this_local;
  
  if (binDir != (char *)0x0) {
    bdir.field_2._8_8_ = binDir;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,binDir,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    lVar5 = std::__cxx11::string::find((char *)local_38,0x8f70de);
    if (lVar5 == -1) {
      cmSystemTools::Error
                ("TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                 (char *)bdir.field_2._8_8_,(char *)0x0,(char *)0x0);
      dir.Internal._0_4_ = 1;
    }
    else {
      cmsys::Directory::Directory(&local_58);
      uVar2 = bdir.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,(char *)uVar2,(allocator *)((long)&fileNum + 7));
      cmsys::Directory::Load(&local_58,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&fileNum + 7));
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
      for (deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          sVar1 = deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
          uVar6 = cmsys::Directory::GetNumberOfFiles(&local_58), sVar1 < uVar6;
          deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count =
               deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
        pcVar7 = cmsys::Directory::GetFile
                           (&local_58,deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        iVar4 = strcmp(pcVar7,".");
        if (iVar4 != 0) {
          pcVar7 = cmsys::Directory::GetFile
                             (&local_58,
                              deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
          iVar4 = strcmp(pcVar7,"..");
          if (iVar4 != 0) {
            pcVar7 = cmsys::Directory::GetFile
                               (&local_58,
                                deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_e0,pcVar7,&local_e1);
            local_c0._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b8,&local_e0);
            local_f0._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_b8);
            bVar3 = std::operator==(&local_c0,&local_f0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_e1);
            if (bVar3) {
              pcVar7 = cmsys::Directory::GetFile
                                 (&local_58,
                                  deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_110,pcVar7,&local_111);
              pVar8 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_b8,&local_110);
              fullPath.field_2._8_8_ = pVar8.first._M_node;
              std::__cxx11::string::~string((string *)&local_110);
              std::allocator<char>::~allocator((allocator<char> *)&local_111);
              uVar2 = bdir.field_2._8_8_;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_148,(char *)uVar2,
                         (allocator *)(m.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(m.field_2._M_local_buf + 0xf));
              std::__cxx11::string::operator+=((string *)local_148,"/");
              pcVar7 = cmsys::Directory::GetFile
                                 (&local_58,
                                  deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
              std::__cxx11::string::operator+=((string *)local_148,pcVar7);
              bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_148);
              if (bVar3) {
                pcVar7 = (char *)std::__cxx11::string::c_str();
                CleanupFiles(this,pcVar7);
                cmsys::SystemTools::RemoveADirectory((string *)local_148);
              }
              else {
                bVar3 = cmsys::SystemTools::RemoveFile((string *)local_148);
                if (!bVar3) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_170,"Remove failed on file: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_148);
                  pcVar7 = (char *)std::__cxx11::string::c_str();
                  cmSystemTools::ReportLastSystemError(pcVar7);
                  std::__cxx11::string::~string((string *)local_170);
                }
              }
              std::__cxx11::string::~string((string *)local_148);
            }
          }
        }
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8);
      cmsys::Directory::~Directory(&local_58);
      dir.Internal._0_4_ = 0;
    }
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(const char* binDir)
{
  if ( !binDir )
    {
    return;
    }

  std::string bdir = binDir;
  if(bdir.find("CMakeTmp") == std::string::npos)
    {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:", binDir);
    return;
    }

  cmsys::Directory dir;
  dir.Load(binDir);
  size_t fileNum;
  std::set<std::string> deletedFiles;
  for (fileNum = 0; fileNum <  dir.GetNumberOfFiles(); ++fileNum)
    {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".."))
      {

      if(deletedFiles.find( dir.GetFile(static_cast<unsigned long>(fileNum)))
         == deletedFiles.end())
        {
        deletedFiles.insert(dir.GetFile(static_cast<unsigned long>(fileNum)));
        std::string fullPath = binDir;
        fullPath += "/";
        fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        if(cmSystemTools::FileIsDirectory(fullPath))
          {
          this->CleanupFiles(fullPath.c_str());
          cmSystemTools::RemoveADirectory(fullPath);
          }
        else
          {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while(!cmSystemTools::RemoveFile(fullPath.c_str()) &&
                --retry.Count && cmSystemTools::FileExists(fullPath.c_str()))
            {
            cmSystemTools::Delay(retry.Delay);
            }
          if(retry.Count == 0)
#else
          if(!cmSystemTools::RemoveFile(fullPath))
#endif
            {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
            }
          }
        }
      }
    }
}